

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_randomnumberutil.cpp
# Opt level: O2

void __thiscall
RandomNumberUtil_GetRandomBytes16_Test::TestBody(RandomNumberUtil_GetRandomBytes16_Test *this)

{
  _Alloc_hider s1_expression;
  char *pcVar1;
  AssertHelper s2;
  pointer in_stack_ffffffffffffff50;
  pointer in_stack_ffffffffffffff58;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  
  cfd::core::RandomNumberUtil::GetRandomBytes(&bytes,0x10);
  cfd::core::RandomNumberUtil::GetRandomBytes(&bytes2,0x10);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"bytes.size()","static_cast<size_t>(size)",
             (unsigned_long *)&stack0xffffffffffffff60,(unsigned_long *)&stack0xffffffffffffff48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&stack0xffffffffffffff60);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_randomnumberutil.cpp"
               ,0x26,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffff48,(Message *)&stack0xffffffffffffff60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&stack0xffffffffffffff60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  s1_expression._M_p =
       (pointer)(bytes2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish +
                -(long)bytes2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start);
  s2.data_ = (AssertHelperData *)0x10;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"bytes2.size()","static_cast<size_t>(size)",
             (unsigned_long *)&stack0xffffffffffffff60,(unsigned_long *)&stack0xffffffffffffff48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&stack0xffffffffffffff60);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_randomnumberutil.cpp"
               ,0x27,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffff48,(Message *)&stack0xffffffffffffff60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&stack0xffffffffffffff60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ByteData::ByteData((ByteData *)&stack0xffffffffffffff48,&bytes);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar,(ByteData *)&stack0xffffffffffffff48);
  cfd::core::ByteData::ByteData((ByteData *)&local_20,&bytes2);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&stack0xffffffffffffff60,(ByteData *)&local_20);
  testing::internal::CmpHelperSTRNE
            (s1_expression._M_p,(char *)in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,
             (char *)s2.data_);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_20);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffff48
            );
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_randomnumberutil.cpp"
               ,0x29,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffff60,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff60);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&bytes2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

TEST(RandomNumberUtil, GetRandomBytes16) {
  int size = 16;
  std::vector<uint8_t> bytes = RandomNumberUtil::GetRandomBytes(size);
  std::vector<uint8_t> bytes2 = RandomNumberUtil::GetRandomBytes(size);
  EXPECT_EQ(bytes.size(), static_cast<size_t>(size));
  EXPECT_EQ(bytes2.size(), static_cast<size_t>(size));
  EXPECT_STRNE(ByteData(bytes).GetHex().c_str(),
               ByteData(bytes2).GetHex().c_str());
}